

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool testing::internal::ParseGoogleTestFlag(char *arg)

{
  bool bVar1;
  undefined1 local_48 [8];
  bool value;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  local_48[0] = FLAGS_gtest_also_run_disabled_tests;
  bVar1 = ParseFlag(arg,"also_run_disabled_tests",(bool *)local_48);
  if (bVar1) {
    FLAGS_gtest_also_run_disabled_tests = local_48[0];
  }
  else {
    local_48[0] = FLAGS_gtest_break_on_failure;
    bVar1 = ParseFlag(arg,"break_on_failure",(bool *)local_48);
    if (bVar1) {
      FLAGS_gtest_break_on_failure = local_48[0];
    }
    else {
      local_48[0] = FLAGS_gtest_catch_exceptions;
      bVar1 = ParseFlag(arg,"catch_exceptions",(bool *)local_48);
      if (!bVar1) {
        local_48 = (undefined1  [8])&local_38;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_48,FLAGS_gtest_color_abi_cxx11_,
                   DAT_001536b8 + FLAGS_gtest_color_abi_cxx11_);
        bVar1 = ParseFlag<std::__cxx11::string>
                          (arg,"color",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_48);
        if (bVar1) {
          std::__cxx11::string::_M_assign((string *)&FLAGS_gtest_color_abi_cxx11_);
        }
        if (local_48 != (undefined1  [8])&local_38) {
          operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
        }
        if (bVar1) {
          return true;
        }
        local_48 = (undefined1  [8])&local_38;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_48,FLAGS_gtest_death_test_style_abi_cxx11_,
                   DAT_00153628 + FLAGS_gtest_death_test_style_abi_cxx11_);
        bVar1 = ParseFlag<std::__cxx11::string>
                          (arg,"death_test_style",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_48);
        if (bVar1) {
          std::__cxx11::string::_M_assign((string *)&FLAGS_gtest_death_test_style_abi_cxx11_);
        }
        if (local_48 != (undefined1  [8])&local_38) {
          operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
        }
        if (bVar1) {
          return true;
        }
        local_48[0] = FLAGS_gtest_death_test_use_fork;
        bVar1 = ParseFlag(arg,"death_test_use_fork",(bool *)local_48);
        if (bVar1) {
          FLAGS_gtest_death_test_use_fork = local_48[0];
          return true;
        }
        local_48[0] = FLAGS_gtest_fail_fast;
        bVar1 = ParseFlag(arg,"fail_fast",(bool *)local_48);
        if (bVar1) {
          FLAGS_gtest_fail_fast = local_48[0];
          return true;
        }
        local_48 = (undefined1  [8])&local_38;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_48,FLAGS_gtest_filter_abi_cxx11_,
                   DAT_001536d8 + FLAGS_gtest_filter_abi_cxx11_);
        bVar1 = ParseFlag<std::__cxx11::string>
                          (arg,"filter",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_48);
        if (bVar1) {
          std::__cxx11::string::_M_assign((string *)&FLAGS_gtest_filter_abi_cxx11_);
        }
        if (local_48 != (undefined1  [8])&local_38) {
          operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
        }
        if (bVar1) {
          return true;
        }
        local_48 = (undefined1  [8])&local_38;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_48,FLAGS_gtest_internal_run_death_test_abi_cxx11_,
                   DAT_00153650 + FLAGS_gtest_internal_run_death_test_abi_cxx11_);
        bVar1 = ParseFlag<std::__cxx11::string>
                          (arg,"internal_run_death_test",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_48);
        if (bVar1) {
          std::__cxx11::string::_M_assign((string *)&FLAGS_gtest_internal_run_death_test_abi_cxx11_)
          ;
        }
        if (local_48 != (undefined1  [8])&local_38) {
          operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
        }
        if (bVar1) {
          return true;
        }
        local_48[0] = FLAGS_gtest_list_tests;
        bVar1 = ParseFlag(arg,"list_tests",(bool *)local_48);
        if (bVar1) {
          FLAGS_gtest_list_tests = local_48[0];
          return true;
        }
        local_48 = (undefined1  [8])&local_38;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_48,FLAGS_gtest_output_abi_cxx11_,
                   DAT_00153700 + FLAGS_gtest_output_abi_cxx11_);
        bVar1 = ParseFlag<std::__cxx11::string>
                          (arg,"output",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_48);
        if (bVar1) {
          std::__cxx11::string::_M_assign((string *)&FLAGS_gtest_output_abi_cxx11_);
        }
        if (local_48 != (undefined1  [8])&local_38) {
          operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
        }
        if (bVar1) {
          return true;
        }
        local_48[0] = FLAGS_gtest_brief;
        bVar1 = ParseFlag(arg,"brief",(bool *)local_48);
        if (bVar1) {
          FLAGS_gtest_brief = local_48[0];
          return true;
        }
        local_48[0] = FLAGS_gtest_print_time;
        bVar1 = ParseFlag(arg,"print_time",(bool *)local_48);
        if (bVar1) {
          FLAGS_gtest_print_time = local_48[0];
          return true;
        }
        local_48[0] = FLAGS_gtest_print_utf8;
        bVar1 = ParseFlag(arg,"print_utf8",(bool *)local_48);
        if (bVar1) {
          FLAGS_gtest_print_utf8 = local_48[0];
          return true;
        }
        local_48._0_4_ = FLAGS_gtest_random_seed;
        bVar1 = ParseFlag(arg,"random_seed",(int32_t *)local_48);
        if (bVar1) {
          FLAGS_gtest_random_seed = local_48._0_4_;
          return true;
        }
        local_48._0_4_ = FLAGS_gtest_repeat;
        bVar1 = ParseFlag(arg,"repeat",(int32_t *)local_48);
        if (bVar1) {
          FLAGS_gtest_repeat = local_48._0_4_;
          return true;
        }
        local_48[0] = FLAGS_gtest_recreate_environments_when_repeating;
        bVar1 = ParseFlag(arg,"recreate_environments_when_repeating",(bool *)local_48);
        if (bVar1) {
          FLAGS_gtest_recreate_environments_when_repeating = local_48[0];
          return true;
        }
        local_48[0] = FLAGS_gtest_shuffle;
        bVar1 = ParseFlag(arg,"shuffle",(bool *)local_48);
        if (bVar1) {
          FLAGS_gtest_shuffle = local_48[0];
          return true;
        }
        local_48._0_4_ = FLAGS_gtest_stack_trace_depth;
        bVar1 = ParseFlag(arg,"stack_trace_depth",(int32_t *)local_48);
        if (bVar1) {
          FLAGS_gtest_stack_trace_depth = local_48._0_4_;
          return true;
        }
        local_48 = (undefined1  [8])&local_38;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_48,FLAGS_gtest_stream_result_to_abi_cxx11_,
                   DAT_00153738 + FLAGS_gtest_stream_result_to_abi_cxx11_);
        bVar1 = ParseFlag<std::__cxx11::string>
                          (arg,"stream_result_to",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_48);
        if (bVar1) {
          std::__cxx11::string::_M_assign((string *)&FLAGS_gtest_stream_result_to_abi_cxx11_);
        }
        if (local_48 != (undefined1  [8])&local_38) {
          operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
        }
        if (bVar1) {
          return true;
        }
        local_48[0] = FLAGS_gtest_throw_on_failure;
        bVar1 = ParseFlag(arg,"throw_on_failure",(bool *)local_48);
        if (!bVar1) {
          return bVar1;
        }
        FLAGS_gtest_throw_on_failure = local_48[0];
        return bVar1;
      }
      FLAGS_gtest_catch_exceptions = local_48[0];
    }
  }
  return true;
}

Assistant:

static bool ParseGoogleTestFlag(const char* const arg) {
#define GTEST_INTERNAL_PARSE_FLAG(flag_name)  \
  do {                                        \
    auto value = GTEST_FLAG_GET(flag_name);   \
    if (ParseFlag(arg, #flag_name, &value)) { \
      GTEST_FLAG_SET(flag_name, value);       \
      return true;                            \
    }                                         \
  } while (false)

  GTEST_INTERNAL_PARSE_FLAG(also_run_disabled_tests);
  GTEST_INTERNAL_PARSE_FLAG(break_on_failure);
  GTEST_INTERNAL_PARSE_FLAG(catch_exceptions);
  GTEST_INTERNAL_PARSE_FLAG(color);
  GTEST_INTERNAL_PARSE_FLAG(death_test_style);
  GTEST_INTERNAL_PARSE_FLAG(death_test_use_fork);
  GTEST_INTERNAL_PARSE_FLAG(fail_fast);
  GTEST_INTERNAL_PARSE_FLAG(filter);
  GTEST_INTERNAL_PARSE_FLAG(internal_run_death_test);
  GTEST_INTERNAL_PARSE_FLAG(list_tests);
  GTEST_INTERNAL_PARSE_FLAG(output);
  GTEST_INTERNAL_PARSE_FLAG(brief);
  GTEST_INTERNAL_PARSE_FLAG(print_time);
  GTEST_INTERNAL_PARSE_FLAG(print_utf8);
  GTEST_INTERNAL_PARSE_FLAG(random_seed);
  GTEST_INTERNAL_PARSE_FLAG(repeat);
  GTEST_INTERNAL_PARSE_FLAG(recreate_environments_when_repeating);
  GTEST_INTERNAL_PARSE_FLAG(shuffle);
  GTEST_INTERNAL_PARSE_FLAG(stack_trace_depth);
  GTEST_INTERNAL_PARSE_FLAG(stream_result_to);
  GTEST_INTERNAL_PARSE_FLAG(throw_on_failure);
  return false;
}